

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddEaRg<(moira::Instr)118,(moira::Mode)7,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Dn dn;
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  long in_RDI;
  Dn dst;
  Ea<(moira::Mode)7,_(moira::Size)4> src;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  
  Op<(moira::Mode)7,(moira::Size)4>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,
             (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  Dn::Dn((Dn *)&stack0xffffffffffffffcc,(int)(uint)in_CX >> 9 & 7);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)*(int *)(in_RDI + 0x14));
  pSVar1 = StrWriter::operator<<
                     ((StrWriter *)in_stack_ffffffffffffffd0,
                      (Ea<(moira::Mode)7,_(moira::Size)4> *)
                      CONCAT26(in_stack_ffffffffffffffce,
                               CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  pSVar1 = StrWriter::operator<<(pSVar1,", ");
  dn.raw._2_2_ = in_stack_ffffffffffffffce;
  dn.raw._0_2_ = in_stack_ffffffffffffffcc;
  StrWriter::operator<<(pSVar1,dn);
  return;
}

Assistant:

void
Moira::dasmAddEaRg(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}